

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.cpp
# Opt level: O3

void __thiscall sjtu::TrainManager::refund_ticket(TrainManager *this,orderType *order)

{
  char (*pacVar1) [41];
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  orderType *poVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  undefined4 extraout_var;
  long lVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  stationType *__s;
  int *piVar11;
  bool bVar12;
  pair<long,_bool> pVar13;
  long *local_e8;
  size_t local_e0;
  long local_d8 [2];
  trainType *local_c8;
  orderType *local_c0;
  long *local_b8;
  size_t local_b0;
  long local_a8 [2];
  TrainManager *local_98;
  char (*local_90) [41];
  char (*local_88) [41];
  long *local_80;
  long local_78;
  long local_70 [2];
  string local_60;
  long local_40;
  undefined1 local_38;
  trainType *this_01;
  
  this_00 = this->TrainBpTree;
  local_80 = local_70;
  sVar6 = strlen(order->trainID);
  local_c0 = order;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,order->trainID,order->trainID + sVar6);
  if (local_78 == 0) {
    local_e8 = (long *)0x0;
  }
  else {
    lVar9 = 0;
    lVar7 = 0;
    uVar8 = 0;
    do {
      lVar7 = ((long)*(char *)((long)local_80 + lVar9) + lVar7 * 0x239 + 0x100) % 0x3b800001;
      uVar8 = (long)((long)*(char *)((long)local_80 + lVar9) + uVar8 * 0x301 + 0x100) % 0x3b9aca07;
      lVar9 = lVar9 + 1;
    } while (local_78 != lVar9);
    local_e8 = (long *)(lVar7 << 0x20 | uVar8);
  }
  pVar13 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (this_00,(unsigned_long_long *)&local_e8);
  local_40 = pVar13.first;
  local_38 = pVar13.second;
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  iVar4 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[2])
                    (this->TrainFile,&local_40);
  poVar2 = local_c0;
  this_01 = (trainType *)CONCAT44(extraout_var,iVar4);
  iVar4 = timeType::dateminus(local_c0->date,this_01->saleDate);
  pacVar1 = poVar2->station;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  sVar6 = strlen(*pacVar1);
  local_88 = pacVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,pacVar1,poVar2->station[0] + sVar6);
  local_c8 = this_01;
  iVar5 = trainType::get_Delta_date(this_01,&local_60);
  local_98 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (0 < local_c8->stationNum) {
    __s = local_c8->stations;
    local_90 = local_c0->station + 1;
    piVar11 = local_c8->stations[0].seatNum + (iVar5 + iVar4);
    lVar7 = 0;
    bVar10 = false;
    do {
      local_e8 = local_d8;
      if (bVar10) {
        *piVar11 = *piVar11 + local_c0->num;
      }
      sVar6 = strlen(__s->stationName);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,__s,__s->stationName + sVar6);
      pacVar1 = local_90;
      local_b8 = local_a8;
      sVar6 = strlen(*local_90);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,pacVar1,*pacVar1 + sVar6);
      plVar3 = local_b8;
      if (local_e0 == local_b0) {
        if (local_e0 == 0) {
          bVar12 = true;
        }
        else {
          iVar4 = bcmp(local_e8,local_b8,local_e0);
          bVar12 = iVar4 == 0;
        }
      }
      else {
        bVar12 = false;
      }
      if (plVar3 != local_a8) {
        operator_delete(plVar3,local_a8[0] + 1);
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8,local_d8[0] + 1);
      }
      if (bVar12) break;
      local_e8 = local_d8;
      sVar6 = strlen(__s->stationName);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,__s,__s->stationName + sVar6);
      pacVar1 = local_88;
      local_b8 = local_a8;
      sVar6 = strlen(*local_88);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,pacVar1,*pacVar1 + sVar6);
      plVar3 = local_b8;
      if (local_e0 == local_b0) {
        if (local_e0 == 0) {
          bVar12 = true;
        }
        else {
          iVar4 = bcmp(local_e8,local_b8,local_e0);
          bVar12 = iVar4 == 0;
        }
      }
      else {
        bVar12 = false;
      }
      if (plVar3 != local_a8) {
        operator_delete(plVar3,local_a8[0] + 1);
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8,local_d8[0] + 1);
      }
      bVar10 = (bool)(bVar10 | bVar12);
      lVar7 = lVar7 + 1;
      piVar11 = piVar11 + 0x6a;
      __s = __s + 1;
    } while (lVar7 < local_c8->stationNum);
  }
  (*(local_98->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[3])
            (local_98->TrainFile,&local_c8->offset);
  return;
}

Assistant:

void TrainManager::refund_ticket(orderType *order)
	{
		auto ret = TrainBpTree -> find(hasher(order -> trainID));
		trainType *train = TrainFile -> read(ret.first);
		int day_id = timeType::dateminus(order -> date[0] , train -> saleDate[0]) + train -> get_Delta_date(std::string(order -> station[0]));
		bool flag = false;
		for (int i = 0;i < train -> stationNum;++ i)
		{
			if (flag) train -> stations[i].seatNum[day_id] += order -> num;
			if (std::string(train -> stations[i].stationName) == std::string(order -> station[1])) break;
			if (std::string(train -> stations[i].stationName) == std::string(order -> station[0])) flag = true;
		}
		TrainFile -> save(train -> offset);
	}